

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O3

SHEMU_STATUS ShemuMemStore(SHEMU_CONTEXT *Context,ND_UINT64 Gla,ND_UINT64 Size,ND_UINT8 *Value)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ND_UINT8 *pNVar4;
  ND_BOOL NVar5;
  ulong uVar6;
  ShemuMemAccess p_Var7;
  ND_UINT64 NVar8;
  
  uVar6 = Context->ShellcodeBase;
  if (uVar6 <= Gla) {
    uVar1 = Context->ShellcodeSize + uVar6;
    if ((((Gla < uVar1) && (Size <= Context->ShellcodeSize)) && (uVar2 = Size + Gla, uVar6 < uVar2))
       && (uVar2 <= uVar1)) {
      uVar1 = Context->Options;
      if ((uVar1 & 4) != 0) {
        return 0;
      }
      uVar3 = (Context->Icache).Address;
      if (((uVar3 <= Gla) && (Gla < (Context->Icache).Size + uVar3)) ||
         ((uVar3 <= uVar2 - 1 && (uVar2 - 1 < uVar3 + (Context->Icache).Size)))) {
        (Context->Icache).Address = 0;
        (Context->Icache).Size = 0;
      }
      if ((uVar1 & 0x20) == 0) {
        if (Size == 0) {
          return 0;
        }
        if (Value == (ND_UINT8 *)0x0) {
          return 0;
        }
        pNVar4 = Context->Shellcode;
        if (pNVar4 + (Gla - uVar6) == (ND_UINT8 *)0x0) {
          return 0;
        }
        NVar8 = 0;
        do {
          (pNVar4 + (Gla - uVar6))[NVar8] = Value[NVar8];
          NVar8 = NVar8 + 1;
        } while (Size != NVar8);
        return 0;
      }
      p_Var7 = Context->AccessShellcode;
      goto LAB_00164b37;
    }
  }
  uVar6 = Context->StackBase;
  if (uVar6 <= Gla) {
    uVar1 = Context->StackSize + uVar6;
    if (((Gla < uVar1) && (Size <= Context->StackSize)) &&
       ((uVar6 < Size + Gla && (Size + Gla <= uVar1)))) {
      if (Size == 0) {
        return 0;
      }
      if (Value == (ND_UINT8 *)0x0) {
        return 0;
      }
      pNVar4 = Context->Stack;
      if (pNVar4 + (Gla - uVar6) == (ND_UINT8 *)0x0) {
        return 0;
      }
      NVar8 = 0;
      do {
        (pNVar4 + (Gla - uVar6))[NVar8] = Value[NVar8];
        NVar8 = NVar8 + 1;
      } while (Size != NVar8);
      return 0;
    }
  }
  uVar6 = Context->ExtMemAccess + 1;
  Context->ExtMemAccess = uVar6;
  if (Context->MemThreshold < uVar6) {
    return 1;
  }
  p_Var7 = Context->AccessMemory;
LAB_00164b37:
  if (p_Var7 == (ShemuMemAccess)0x0) {
    return 1;
  }
  NVar5 = (*p_Var7)(Context,Gla,Size,Value,'\x01');
  if (NVar5 != '\0') {
    return 0;
  }
  return 1;
}

Assistant:

SHEMU_STATUS
ShemuMemStore(
    SHEMU_CONTEXT *Context,
    ND_UINT64 Gla,
    ND_UINT64 Size,
    ND_UINT8 *Value
    )
{
    if (ShemuIsShellcodePtr(Context, Gla, Size))
    {
        // Bypass self-writes, if needed to. No need to invalidate the icache in this case.
        if (!!(Context->Options & SHEMU_OPT_BYPASS_SELF_WRITES))
        {
            return SHEMU_SUCCESS;
        }

        // Flush the instruction cache, if any stored address in it. We can do this AFTER checking
        // for SHEMU_OPT_BYPASS_SELF_WRITES - with that flag set, the shellcode will never be modified.
        if (ShemuIsIcachePtr(Context, Gla, 1) || ShemuIsIcachePtr(Context, Gla + Size - 1, 1))
        {
            ShemuFlushIcache(Context);
        }

        // Shellcode access.
        if (0 == (Context->Options & SHEMU_OPT_DIRECT_MAPPED_SHELL))
        {
            // Shellocode is local copy, we can directly access it.
            ShemuCopyMem(Context->Shellcode + (Gla - Context->ShellcodeBase), Value, Size);
        }
        else
        {
            // Shellcode is directly mapped, we must go through the memory access API. Note that the integrator
            // is free to do whatever it wants with this call - generally, it is a good idea to just discard 
            // modifications. For safety, currently we force the SHEMU_OPT_BYPASS_SELF_WRITES option whenever
            // the SHEMU_OPT_DIRECT_MAPPED_SHELL option is used, to avoid problems.
            if ((ND_NULL == Context->AccessShellcode) ||
                !Context->AccessShellcode(Context, Gla, (ND_SIZET)Size, Value, ND_TRUE))
            {
                return SHEMU_ABORT_GLA_OUTSIDE;
            }
        }
    }
    else if (ShemuIsStackPtr(Context, Gla, Size))
    {
        ShemuCopyMem(Context->Stack + (Gla - Context->StackBase), Value, Size);
    }
    else
    {
        ND_BOOL res = ND_FALSE;

        // We allow a maximum number of external memory accesses, due to performance reasons.
        if (++Context->ExtMemAccess > Context->MemThreshold)
        {
            return SHEMU_ABORT_GLA_OUTSIDE;
        }

        // Handling external stores made by the shellcode can be done in a variety of ways by the integrator. Some
        // of the solutions are:
        // - Abort on external stores; this will cause the emulation to immediately stop;
        // - Discard external stores; this is very simple, and it assumes that modified memory addresses will
        //   not be read later on by the shellcode;
        // - Create a store-buffer like structure, where every external store is cached; when a load is issued on
        //   a previously written address, the value from the store-buffer can be returned;
        // For obvious reasons, actually storing the value at the indicated address is a very, very bad idea.
        if (ND_NULL != Context->AccessMemory)
        {
            res = Context->AccessMemory(Context, Gla, (ND_SIZET)Size, Value, ND_TRUE);
        }

        if (res)
        {
            return SHEMU_SUCCESS;
        }

        return SHEMU_ABORT_GLA_OUTSIDE;
    }

    return SHEMU_SUCCESS;
}